

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# u64.c
# Opt level: O0

void u64From(u64 *dest,void *src,size_t count)

{
  void *in_RDX;
  void *in_RSI;
  
  memMove(in_RSI,in_RDX,0x11eee5);
  if (((ulong)in_RDX & 7) != 0) {
    memSet(in_RSI,(octet)((ulong)in_RDX >> 0x38),0x11ef13);
  }
  return;
}

Assistant:

void u64From(u64 dest[], const void* src, size_t count)
{
	ASSERT(memIsValid(src, count));
	ASSERT(memIsValid(dest, ((count + 7) / 8) * 8));
	memMove(dest, src, count);
	if (count % 8)
		memSetZero((octet*)dest + count, 8 - count % 8);
#if (OCTET_ORDER == BIG_ENDIAN)
	for (count = (count + 7) / 8; count--;)
		dest[count] = u64Rev(dest[count]);
#endif // OCTET_ORDER
}